

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTcpIpLink.cpp
# Opt level: O0

int __thiscall xe::TcpIpLink::connect(TcpIpLink *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  deBool dVar1;
  deSocketState dVar2;
  CommLinkState CVar3;
  Error *pEVar4;
  socklen_t __len_00;
  sockaddr *__addr_00;
  bool bVar5;
  byte local_69;
  byte local_59;
  exception *e;
  SocketAddress *address_local;
  TcpIpLink *this_local;
  
  while( true ) {
    dVar1 = deGetFalse();
    bVar5 = false;
    if (dVar1 == 0) {
      dVar2 = de::Socket::getState(&this->m_socket);
      bVar5 = dVar2 == DE_SOCKETSTATE_CLOSED;
    }
    if (!bVar5) break;
    dVar1 = deGetFalse();
    if (dVar1 == 0) {
      while( true ) {
        dVar1 = deGetFalse();
        bVar5 = false;
        if (dVar1 == 0) {
          CVar3 = TcpIpLinkState::getState(&this->m_state);
          bVar5 = CVar3 == COMMLINKSTATE_ERROR;
        }
        if (!bVar5) break;
        dVar1 = deGetFalse();
        if (dVar1 == 0) {
          while( true ) {
            dVar1 = deGetFalse();
            local_59 = 0;
            if (dVar1 == 0) {
              bVar5 = TcpIpSendThread::isRunning(&this->m_sendThread);
              local_59 = bVar5 ^ 0xff;
            }
            if ((local_59 & 1) == 0) break;
            dVar1 = deGetFalse();
            if (dVar1 == 0) {
              while( true ) {
                dVar1 = deGetFalse();
                local_69 = 0;
                if (dVar1 == 0) {
                  bVar5 = TcpIpRecvThread::isRunning(&this->m_recvThread);
                  local_69 = bVar5 ^ 0xff;
                }
                __len_00 = 0;
                if ((local_69 & 1) == 0) break;
                dVar1 = deGetFalse();
                if (dVar1 == 0) {
                  de::Socket::connect(&this->m_socket,__fd,__addr_00,__len_00);
                  TcpIpLinkState::setState(&this->m_state,COMMLINKSTATE_READY,"");
                  TcpIpLinkState::onKeepaliveReceived(&this->m_state);
                  TcpIpSendThread::start(&this->m_sendThread);
                  TcpIpRecvThread::start(&this->m_recvThread);
                  while( true ) {
                    dVar1 = deGetFalse();
                    bVar5 = false;
                    if (dVar1 == 0) {
                      dVar1 = deTimer_scheduleInterval(this->m_keepaliveTimer,5000);
                      bVar5 = dVar1 != 0;
                    }
                    if (!bVar5) break;
                    dVar1 = deGetFalse();
                    if (dVar1 == 0) {
                      return 0;
                    }
                  }
                  pEVar4 = (Error *)__cxa_allocate_exception(0x10);
                  Error::Error(pEVar4,(char *)0x0,
                               "deTimer_scheduleInterval(m_keepaliveTimer, xs::KEEPALIVE_SEND_INTERVAL)"
                               ,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                               ,0x1dd);
                  __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
                }
              }
              pEVar4 = (Error *)__cxa_allocate_exception(0x10);
              Error::Error(pEVar4,(char *)0x0,"!m_recvThread.isRunning()",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                           ,0x1cf);
              __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
            }
          }
          pEVar4 = (Error *)__cxa_allocate_exception(0x10);
          Error::Error(pEVar4,(char *)0x0,"!m_sendThread.isRunning()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                       ,0x1ce);
          __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
        }
      }
      pEVar4 = (Error *)__cxa_allocate_exception(0x10);
      Error::Error(pEVar4,(char *)0x0,"m_state.getState() == COMMLINKSTATE_ERROR",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                   ,0x1cd);
      __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
    }
  }
  pEVar4 = (Error *)__cxa_allocate_exception(0x10);
  Error::Error(pEVar4,(char *)0x0,"m_socket.getState() == DE_SOCKETSTATE_CLOSED",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
               ,0x1cc);
  __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
}

Assistant:

void TcpIpLink::connect (const de::SocketAddress& address)
{
	XE_CHECK(m_socket.getState() == DE_SOCKETSTATE_CLOSED);
	XE_CHECK(m_state.getState() == COMMLINKSTATE_ERROR);
	XE_CHECK(!m_sendThread.isRunning());
	XE_CHECK(!m_recvThread.isRunning());

	m_socket.connect(address);

	try
	{
		// Clear error and set state to ready.
		m_state.setState(COMMLINKSTATE_READY, "");
		m_state.onKeepaliveReceived();

		// Launch threads.
		m_sendThread.start();
		m_recvThread.start();

		XE_CHECK(deTimer_scheduleInterval(m_keepaliveTimer, xs::KEEPALIVE_SEND_INTERVAL));
	}
	catch (const std::exception& e)
	{
		closeConnection();
		m_state.setState(COMMLINKSTATE_ERROR, e.what());
		throw;
	}
}